

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryInit(TranslateToFuzzReader *this)

{
  Random *this_00;
  Builder *this_01;
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> _Var1;
  IString segment;
  uint32_t uVar2;
  Expression *pEVar3;
  Const *offset;
  Const *size;
  MemoryInit *pMVar4;
  uint32_t uVar5;
  
  if (this->allowMemory != false) {
    this_00 = &this->random;
    uVar2 = Random::upTo(this_00,(uint32_t)
                                 ((ulong)((long)(this->wasm->dataSegments).
                                                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->wasm->dataSegments).
                                               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
    _Var1.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
         (this->wasm->dataSegments).
         super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>;
    segment.str = *(string_view *)
                   _Var1.
                   super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                   .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    uVar5 = *(int *)&((IString *)
                     ((long)_Var1.
                            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                            .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x40))
                     ->str -
            *(int *)((long)_Var1.
                           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                           .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x38);
    uVar2 = Random::upTo(this_00,uVar5);
    uVar5 = Random::upTo(this_00,uVar5 - uVar2);
    pEVar3 = makePointer(this);
    this_01 = &this->builder;
    offset = Builder::makeConst<int>(this_01,uVar2);
    size = Builder::makeConst<int>(this_01,uVar5);
    pMVar4 = Builder::makeMemoryInit
                       (this_01,(Name)segment.str,pEVar3,(Expression *)offset,(Expression *)size,
                        (Name)*(string_view *)
                               (((this->wasm->memories).
                                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                       );
    return (Expression *)pMVar4;
  }
  pEVar3 = makeTrivial(this,(Type)0x0);
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryInit() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Index segIdx = upTo(wasm.dataSegments.size());
  Name segment = wasm.dataSegments[segIdx]->name;
  size_t totalSize = wasm.dataSegments[segIdx]->data.size();
  size_t offsetVal = upTo(totalSize);
  size_t sizeVal = upTo(totalSize - offsetVal);
  Expression* dest = makePointer();
  Expression* offset = builder.makeConst(int32_t(offsetVal));
  Expression* size = builder.makeConst(int32_t(sizeVal));
  return builder.makeMemoryInit(
    segment, dest, offset, size, wasm.memories[0]->name);
}